

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall
CommandLineArguments::addStrictNameFilter(CommandLineArguments *this,int ac,char **av,int *index)

{
  TestFilter *pTVar1;
  int ac_00;
  SimpleString SStack_48;
  
  pTVar1 = (TestFilter *)
           operator_new(0x20,
                        "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O1/CMake/cpputest/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                        ,0x132);
  ac_00 = 0x14726a;
  SimpleString::SimpleString(&SStack_48,"-sn");
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffc8,ac_00,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)index);
  TestFilter::TestFilter(pTVar1,(SimpleString *)&stack0xffffffffffffffc8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  SimpleString::~SimpleString(&SStack_48);
  TestFilter::strictMatching(pTVar1);
  pTVar1 = TestFilter::add(pTVar1,this->nameFilters_);
  this->nameFilters_ = pTVar1;
  return;
}

Assistant:

void CommandLineArguments::addStrictNameFilter(int ac, const char *const *av, int& index)
{
    TestFilter* nameFilter = new TestFilter(getParameterField(ac, av, index, "-sn"));
    nameFilter->strictMatching();
    nameFilters_= nameFilter->add(nameFilters_);
}